

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapBase.h
# Opt level: O2

void __thiscall
Eigen::internal::
mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_-1,_1,_false>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
::mapbase_evaluator(mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                    *this,XprType *map)

{
  this->m_data = (map->
                 super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_Eigen::Dense>
                 ).
                 super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false>,_0>
                 .m_data;
  (this->m_innerStride).m_value =
       (((map->
         super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_Eigen::Dense>
         ).
         super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
         .m_xpr.m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_rows;
  variable_if_dynamic<long,_1>::variable_if_dynamic
            ((variable_if_dynamic<long,_1> *)&this->field_0x10,
             (map->
             super_BlockImpl<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_Eigen::Dense>
             ).
             super_BlockImpl_dense<const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,__1,_1,_false,_true>
             .m_outerStride);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC inline const Scalar* data() const { return m_data; }